

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O0

void __thiscall
HVectorBase<double>::copy<HighsCDouble>(HVectorBase<double> *this,HVectorBase<HighsCDouble> *from)

{
  int iVar1;
  int iVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  long in_RSI;
  long in_RDI;
  double dVar7;
  HighsCDouble xFrom;
  HighsInt iFrom;
  HighsInt i;
  HighsCDouble *fromArray;
  HighsInt *fromIndex;
  HighsInt fromCount;
  HighsCDouble local_40;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar8;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar9;
  
  clear((HVectorBase<double> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  *(undefined8 *)(in_RDI + 0x38) = *(undefined8 *)(in_RSI + 0x38);
  iVar1 = *(int *)(in_RSI + 4);
  *(int *)(in_RDI + 4) = iVar1;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RSI + 8),0);
  pvVar4 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                     ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)(in_RSI + 0x20),0);
  for (iVar9 = 0; iVar9 < iVar1; iVar9 = iVar9 + 1) {
    iVar2 = pvVar3[iVar9];
    local_40.hi = pvVar4[iVar2].hi;
    local_40.lo = pvVar4[iVar2].lo;
    iVar8 = iVar2;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)iVar9);
    *pvVar5 = iVar2;
    dVar7 = HighsCDouble::operator_cast_to_double(&local_40);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),(long)iVar8);
    *pvVar6 = dVar7;
  }
  return;
}

Assistant:

void HVectorBase<Real>::copy(const HVectorBase<FromReal>* from) {
  /*
   * Copy from another HVector structure to this instance
   * The real type of "from" does not need to be the same, but must be
   * convertible to this HVector's real type.
   */
  clear();
  synthetic_tick = from->synthetic_tick;
  const HighsInt fromCount = count = from->count;
  const HighsInt* fromIndex = &from->index[0];
  const FromReal* fromArray = &from->array[0];
  for (HighsInt i = 0; i < fromCount; i++) {
    const HighsInt iFrom = fromIndex[i];
    const FromReal xFrom = fromArray[iFrom];
    index[i] = iFrom;
    array[iFrom] = Real(xFrom);
  }
}